

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::LogicalType::LogicalType(LogicalType *this,LogicalType *other52)

{
  int32_t iVar1;
  
  *(undefined ***)this = &PTR__LogicalType_004dda58;
  this->STRING = (StringType)&PTR__StringType_004dd308;
  this->MAP = (MapType)&PTR__MapType_004dd3d8;
  this->LIST = (ListType)&PTR__ListType_004dd440;
  this->ENUM = (EnumType)&PTR__EnumType_004dd4a8;
  *(undefined ***)&this->DECIMAL = &PTR__DecimalType_004dd648;
  (this->DECIMAL).scale = 0;
  (this->DECIMAL).precision = 0;
  this->DATE = (DateType)&PTR__DateType_004dd510;
  TimeType::TimeType(&this->TIME);
  TimestampType::TimestampType(&this->TIMESTAMP);
  *(undefined ***)&this->INTEGER = &PTR__IntType_004dd920;
  (this->INTEGER).bitWidth = '\0';
  (this->INTEGER).isSigned = false;
  this->UNKNOWN = (NullType)&PTR__NullType_004dd5e0;
  this->JSON = (JsonType)&PTR__JsonType_004dd988;
  this->BSON = (BsonType)&PTR__BsonType_004dd9f0;
  this->UUID = (UUIDType)&PTR__UUIDType_004dd370;
  this->FLOAT16 = (Float16Type)&PTR__Float16Type_004dd578;
  this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xc000);
  iVar1 = (other52->DECIMAL).precision;
  (this->DECIMAL).scale = (other52->DECIMAL).scale;
  (this->DECIMAL).precision = iVar1;
  (this->TIME).isAdjustedToUTC = (other52->TIME).isAdjustedToUTC;
  (this->TIME).unit.__isset = (other52->TIME).unit.__isset;
  (this->TIMESTAMP).isAdjustedToUTC = (other52->TIMESTAMP).isAdjustedToUTC;
  (this->TIMESTAMP).unit.__isset = (other52->TIMESTAMP).unit.__isset;
  (this->INTEGER).bitWidth = (other52->INTEGER).bitWidth;
  (this->INTEGER).isSigned = (other52->INTEGER).isSigned;
  this->__isset = other52->__isset;
  return;
}

Assistant:

LogicalType::LogicalType(const LogicalType& other52) noexcept {
  STRING = other52.STRING;
  MAP = other52.MAP;
  LIST = other52.LIST;
  ENUM = other52.ENUM;
  DECIMAL = other52.DECIMAL;
  DATE = other52.DATE;
  TIME = other52.TIME;
  TIMESTAMP = other52.TIMESTAMP;
  INTEGER = other52.INTEGER;
  UNKNOWN = other52.UNKNOWN;
  JSON = other52.JSON;
  BSON = other52.BSON;
  UUID = other52.UUID;
  FLOAT16 = other52.FLOAT16;
  __isset = other52.__isset;
}